

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileInfo.h
# Opt level: O1

void __thiscall
llbuild::basic::FileChecksumHasher::readPathStringAndDigest
          (FileChecksumHasher *this,FileChecksum *result)

{
  (*this->_vptr_FileChecksumHasher[3])
            (this,(this->path->_M_dataplus)._M_p,this->path->_M_string_length);
  (*this->_vptr_FileChecksumHasher[2])(this);
  (**this->_vptr_FileChecksumHasher)(this,result);
  return;
}

Assistant:

virtual void readPathStringAndDigest(FileChecksum& result) {
    update(reinterpret_cast<const uint8_t*>(&path[0]), path.size());
    finalize();
    copy(result.bytes);
  }